

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O3

void __thiscall
Assimp::LWSImporter::ReadEnvelope_Old
          (LWSImporter *this,const_iterator *it,const_iterator *end,NodeDesc *nodes,uint param_4)

{
  iterator __position;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  Logger *this_00;
  char cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float f;
  Key key;
  float local_8c;
  NodeDesc *local_88;
  const_iterator *local_80;
  Envelope local_78;
  list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *local_40;
  _List_node_base *local_38;
  
  p_Var1 = it->_M_node->_M_next;
  it->_M_node = p_Var1;
  local_88 = nodes;
  local_80 = end;
  if (p_Var1 == end->_M_node) {
LAB_004533ff:
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"LWS: Encountered unexpected end of file while parsing object motion");
  }
  else {
    p_Var1 = p_Var1[1]._M_next;
    cVar3 = *(char *)&p_Var1->_M_next;
    if (0xf5 < (byte)(cVar3 - 0x3aU)) {
      iVar8 = 0;
      do {
        p_Var1 = (_List_node_base *)((long)&p_Var1->_M_next + 1);
        iVar8 = (uint)(byte)(cVar3 - 0x30) + iVar8 * 10;
        cVar3 = *(char *)&p_Var1->_M_next;
      } while (0xf5 < (byte)(cVar3 - 0x3aU));
      if (iVar8 != 0) {
        local_40 = &nodes->channels;
        iVar5 = 0;
        do {
          local_78._0_8_ = 3.39519326554444e-313;
          local_78.pre = PrePostBehaviour_Constant;
          local_78.post = PrePostBehaviour_Constant;
          local_78.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78.old_first = 0;
          local_78.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.old_last = 0;
          std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::
          _M_insert<Assimp::LWO::Envelope>(local_40,(iterator)local_40,&local_78);
          if (local_78.keys.super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.keys.
                            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.keys.
                                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.keys.
                                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          p_Var1 = (local_88->channels).
                   super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>.
                   _M_impl._M_node.super__List_node_base._M_prev;
          *(int *)&p_Var1[1]._M_next = iVar5;
          iVar5 = iVar5 + 1;
          *(int *)((long)&p_Var1[1]._M_next + 4) = iVar5;
          p_Var2 = it->_M_node->_M_next;
          it->_M_node = p_Var2;
          if (p_Var2 == local_80->_M_node) goto LAB_004533ff;
          p_Var2 = p_Var2[1]._M_next;
          cVar3 = *(char *)&p_Var2->_M_next;
          if (0xf5 < (byte)(cVar3 - 0x3aU)) {
            iVar7 = 0;
            do {
              iVar6 = iVar7;
              p_Var2 = (_List_node_base *)((long)&p_Var2->_M_next + 1);
              bVar4 = cVar3 - 0x30;
              iVar7 = (uint)bVar4 + iVar6 * 10;
              cVar3 = *(char *)&p_Var2->_M_next;
            } while (0xf5 < (byte)(cVar3 - 0x3aU));
            if (iVar7 != 0) {
              local_38 = p_Var1 + 2;
              iVar7 = (uint)bVar4 + iVar6 * 10;
              do {
                p_Var2 = it->_M_node->_M_next;
                it->_M_node = p_Var2;
                if (p_Var2 == local_80->_M_node) goto LAB_004533ff;
                local_78._0_8_ = 0.0;
                local_78.pre = PrePostBehaviour_Reset;
                local_78.post = PrePostBehaviour_Constant;
                local_78.keys.
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_78.keys.
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_78.keys.
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)local_78.keys.
                                      super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffff00000000);
                fast_atoreal_move<float>
                          ((char *)p_Var2[1]._M_next,(float *)((long)&local_78 + 8),true);
                fast_atoreal_move<float>((char *)it->_M_node[1]._M_next,&local_8c,true);
                local_78._0_8_ = (BADTYPE)local_8c;
                __position._M_current = (Key *)p_Var1[2]._M_prev;
                if (__position._M_current == (Key *)p_Var1[3]._M_next) {
                  std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>::
                  _M_realloc_insert<Assimp::LWO::Key_const&>
                            ((vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>> *)local_38,
                             __position,(Key *)&local_78);
                }
                else {
                  *(pointer *)((__position._M_current)->params + 4) =
                       local_78.keys.
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                  *(pointer *)(__position._M_current)->params =
                       local_78.keys.
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  *(pointer *)((__position._M_current)->params + 2) =
                       local_78.keys.
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  (__position._M_current)->time = (double)local_78._0_8_;
                  (__position._M_current)->value = (float)local_78.pre;
                  (__position._M_current)->inter = local_78.post;
                  p_Var1[2]._M_prev = (_List_node_base *)&p_Var1[2]._M_prev[2]._M_prev;
                }
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
          }
        } while (iVar5 != iVar8);
      }
    }
  }
  return;
}

Assistant:

void LWSImporter::ReadEnvelope_Old(
    std::list< LWS::Element >::const_iterator& it,
    const std::list< LWS::Element >::const_iterator& end,
    LWS::NodeDesc& nodes,
    unsigned int /*version*/)
{
    unsigned int num,sub_num;
    if (++it == end)goto unexpected_end;

    num = strtoul10((*it).tokens[0].c_str());
    for (unsigned int i = 0; i < num; ++i) {

        nodes.channels.push_back(LWO::Envelope());
        LWO::Envelope& envl = nodes.channels.back();

        envl.index = i;
        envl.type  = (LWO::EnvelopeType)(i+1);

        if (++it == end)goto unexpected_end;
        sub_num = strtoul10((*it).tokens[0].c_str());

        for (unsigned int n = 0; n < sub_num;++n) {

            if (++it == end)goto unexpected_end;

            // parse value and time, skip the rest for the moment.
            LWO::Key key;
            const char* c = fast_atoreal_move<float>((*it).tokens[0].c_str(),key.value);
            SkipSpaces(&c);
            float f;
            fast_atoreal_move<float>((*it).tokens[0].c_str(),f);
            key.time = f;

            envl.keys.push_back(key);
        }
    }
    return;

unexpected_end:
    ASSIMP_LOG_ERROR("LWS: Encountered unexpected end of file while parsing object motion");
}